

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

void __thiscall
RootIndexProxyModelPrivate::onColumnsAboutToBeInserted
          (RootIndexProxyModelPrivate *this,QModelIndex *parent,int first,int last)

{
  QModelIndex *pQVar1;
  QModelIndex QVar2;
  char cVar3;
  bool bVar4;
  RootIndexProxyModelPrivate *pRVar5;
  RootIndexProxyModelPrivate *this_00;
  QPersistentModelIndex *this_01;
  QModelIndex local_78 [2];
  Data *local_48;
  Connection *pCStack_40;
  QAbstractItemModel *local_38;
  
  pQVar1 = (QModelIndex *)this->q_ptr;
  this_01 = &this->m_rootIndex;
  cVar3 = QPersistentModelIndex::isValid();
  if (cVar3 != '\0') {
    pRVar5 = (RootIndexProxyModelPrivate *)&stack0xffffffffffffffb8;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar5,this_01);
    QVar2.i = (quintptr)pCStack_40;
    QVar2._0_8_ = local_48;
    QVar2.m = local_38;
    bVar4 = isDescendant(pRVar5,QVar2,parent);
    if (bVar4) {
      return;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_78,this_01);
    bVar4 = QModelIndex::operator!=(parent,local_78);
    if (bVar4) {
      QVar2 = *parent;
      pRVar5 = (RootIndexProxyModelPrivate *)(local_78 + 1);
      this_00 = pRVar5;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar5,this_01);
      bVar4 = isDescendant(this_00,QVar2,(QModelIndex *)pRVar5);
      if (!bVar4) {
        return;
      }
    }
  }
  (**(code **)(*(long *)pQVar1 + 0x198))(local_78,pQVar1,parent);
  QAbstractItemModel::beginInsertColumns(pQVar1,(int)local_78,first);
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onColumnsAboutToBeInserted(const QModelIndex &parent, int first, int last)
{
    Q_Q(RootIndexProxyModel);
    Q_ASSERT(!parent.isValid() || parent.model() == q->sourceModel());
    if (m_rootIndex.isValid()) {
        if (isDescendant(m_rootIndex, parent))
            return;
        if (parent != m_rootIndex && !isDescendant(parent, m_rootIndex))
            return;
    }
    q->beginInsertColumns(q->mapFromSource(parent), first, last);
}